

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

void __thiscall wasm::FunctionValidator::visitI31Get(FunctionValidator *this,I31Get *curr)

{
  Type left;
  Type local_30;
  
  ValidationInfo::shouldBeTrue<wasm::I31Get*>
            (this->info,
             (bool)((byte)((((this->
                             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                             ).
                             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .
                             super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .currModule)->features).features >> 10) & 1),curr,
             "i31.get_s/u requires gc [--enable-gc]",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  left.id = (curr->i31->type).id;
  wasm::Type::Type(&local_30,(HeapType)0x4,Nullable);
  shouldBeSubType(this,left,local_30,curr->i31,"i31.get_s/u\'s argument should be i31ref");
  return;
}

Assistant:

void FunctionValidator::visitI31Get(I31Get* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "i31.get_s/u requires gc [--enable-gc]");
  shouldBeSubType(curr->i31->type,
                  Type(HeapType::i31, Nullable),
                  curr->i31,
                  "i31.get_s/u's argument should be i31ref");
}